

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O2

bool __thiscall ghc::filesystem::path::has_relative_path(path *this)

{
  bool bVar1;
  size_type sVar2;
  
  sVar2 = root_name_length(this);
  bVar1 = has_root_directory(this);
  return bVar1 + sVar2 < (this->_path)._M_string_length;
}

Assistant:

GHC_INLINE bool path::has_relative_path() const
{
    auto rootPathLen = _prefixLength + root_name_length() + (has_root_directory() ? 1 : 0);
    return rootPathLen < _path.length();
}